

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

TaggedStringPtr __thiscall
google::protobuf::internal::anon_unknown_7::CreateArenaString
          (anon_unknown_7 *this,Arena *arena,string_view s)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *p;
  size_type local_38;
  const_pointer local_30;
  anon_unknown_7 *local_28;
  Arena *arena_local;
  string_view s_local;
  TaggedStringPtr res;
  
  s_local._M_len = s._M_len;
  local_28 = this;
  arena_local = arena;
  local_30 = std::basic_string_view<char,_std::char_traits<char>_>::data
                       ((basic_string_view<char,_std::char_traits<char>_> *)&arena_local);
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::length
                       ((basic_string_view<char,_std::char_traits<char>_> *)&arena_local);
  p = Arena::Create<std::__cxx11::string,char_const*,unsigned_long>
                ((Arena *)this,&local_30,&local_38);
  TaggedStringPtr::SetMutableArena((TaggedStringPtr *)&s_local._M_str,p);
  return (TaggedStringPtr)s_local._M_str;
}

Assistant:

TaggedStringPtr CreateArenaString(Arena& arena, absl::string_view s) {
  TaggedStringPtr res;
  res.SetMutableArena(Arena::Create<std::string>(&arena, s.data(), s.length()));
  return res;
}